

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::SerializeWithCachedSizes
          (MethodDescriptorProto *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  UnknownFieldSet *unknown_fields;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  MethodDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar3,SERIALIZE,"google.protobuf.MethodDescriptorProto.name");
    psVar5 = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(1,psVar5,output);
  }
  if ((uVar1 & 2) != 0) {
    input_type_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    input_type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar3,SERIALIZE,"google.protobuf.MethodDescriptorProto.input_type");
    psVar5 = input_type_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(2,psVar5,output);
  }
  if ((uVar1 & 4) != 0) {
    output_type_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    output_type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar3,SERIALIZE,"google.protobuf.MethodDescriptorProto.output_type");
    psVar5 = output_type_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(3,psVar5,output);
  }
  if ((uVar1 & 8) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)this->options_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    bVar2 = client_streaming(this);
    internal::WireFormatLite::WriteBool(5,bVar2,output);
  }
  if ((uVar1 & 0x20) != 0) {
    bVar2 = server_streaming(this);
    internal::WireFormatLite::WriteBool(6,bVar2,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = MethodDescriptorProto::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void MethodDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.MethodDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string input_type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->input_type().data(), this->input_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.input_type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->input_type(), output);
  }

  // optional string output_type = 3;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->output_type().data(), this->output_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.MethodDescriptorProto.output_type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->output_type(), output);
  }

  // optional .google.protobuf.MethodOptions options = 4;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, *this->options_, output);
  }

  // optional bool client_streaming = 5 [default = false];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(5, this->client_streaming(), output);
  }

  // optional bool server_streaming = 6 [default = false];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->server_streaming(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.MethodDescriptorProto)
}